

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSIXEnvironmentTest.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_428bc::POSIXEnvironmentTest_basic_Test::~POSIXEnvironmentTest_basic_Test
          (POSIXEnvironmentTest_basic_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(POSIXEnvironmentTest, basic) {
  POSIXEnvironment env;
  env.setIfMissing("a", "aValue");
  env.setIfMissing("b", "bValue");
  env.setIfMissing("a", "NOT HERE");

#if !defined(_WIN32)
  auto result = env.getEnvp();
  EXPECT_EQ(StringRef(result[0]), "a=aValue");
  EXPECT_EQ(StringRef(result[1]), "b=bValue");
  EXPECT_EQ(result[2], nullptr);
#endif
  }